

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

void __thiscall BasicBlock::InvertBranch(BasicBlock *this,BranchInstr *branch)

{
  BasicBlock *pBVar1;
  Type pSVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  long lVar6;
  Func **ppFVar7;
  SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *this_00;
  
  pBVar1 = this->next;
  ppFVar7 = (Func **)&pBVar1->firstInstr;
  if (pBVar1 == (BasicBlock *)0x0) {
    ppFVar7 = &this->func;
  }
  lVar6 = 0x18;
  if (pBVar1 == (BasicBlock *)0x0) {
    lVar6 = 0xd0;
  }
  if (*(BranchInstr **)((long)&(*ppFVar7)->m_alloc + lVar6) != branch) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x49c,"(this->GetLastInstr() == branch)","this->GetLastInstr() == branch");
    if (!bVar4) goto LAB_003fa9de;
    *puVar5 = 0;
  }
  pSVar2 = (this->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
           super_SListNodeBase<Memory::ArenaAllocator>.next;
  this_00 = &this->succList;
  if (((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar2 == this_00) ||
     ((SListBaseCounted<FlowEdge_*,_Memory::ArenaAllocator> *)pSVar2->next->next != this_00)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x49d,"(this->GetSuccList()->HasTwo())","this->GetSuccList()->HasTwo()");
    if (!bVar4) {
LAB_003fa9de:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  IR::BranchInstr::Invert(branch);
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Reverse
            (&this_00->super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>);
  return;
}

Assistant:

void
BasicBlock::InvertBranch(IR::BranchInstr *branch)
{
    Assert(this->GetLastInstr() == branch);
    Assert(this->GetSuccList()->HasTwo());

    branch->Invert();
    this->GetSuccList()->Reverse();
}